

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this)

{
  string *psVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  cmCTestTestProperties *pcVar6;
  pointer this_00;
  double dVar7;
  string line;
  ostringstream cmCTestLog_msg;
  long *local_1f0;
  long local_1e0 [2];
  string local_1d0;
  double local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = cmsys::SystemTools::GetTime();
  local_1b0 = local_1b0 + 0.1;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  psVar1 = &this->ProcessOutput;
  do {
    dVar7 = cmsys::SystemTools::GetTime();
    bVar3 = true;
    if (local_1b0 - dVar7 <= 0.0) {
LAB_00322cfd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                 local_1d0.field_2._M_local_buf[0]) + 1);
      }
      return bVar3;
    }
    iVar4 = cmProcess::GetNextOutputLine(this->TestProcess,&local_1d0,local_1b0 - dVar7);
    if (iVar4 != 2) {
      if (iVar4 == 0) {
        bVar3 = false;
      }
      goto LAB_00322cfd;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x3e,(char *)local_1f0,false);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_1d0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    pcVar6 = this->TestProperties;
    for (this_00 = (pcVar6->TimeoutRegularExpressions).
                   super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (pcVar6->TimeoutRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar3 = cmsys::RegularExpression::find(&this_00->first,(psVar1->_M_dataplus)._M_p);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar5 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Test timeout changed to ",0x18);
        poVar5 = std::ostream::_M_insert<double>(this->TestProperties->AlternateTimeout);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x4e,(char *)local_1f0,false);
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        cmProcess::ResetStartTime(this->TestProcess);
        cmProcess::ChangeTimeout(this->TestProcess,this->TestProperties->AlternateTimeout);
        std::
        vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase_at_end(&this->TestProperties->TimeoutRegularExpressions,
                          (this->TestProperties->TimeoutRegularExpressions).
                          super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        break;
      }
      pcVar6 = this->TestProperties;
    }
  } while( true );
}

Assistant:

bool cmCTestRunTest::CheckOutput()
{
  // Read lines for up to 0.1 seconds of total time.
  double timeout = 0.1;
  double timeEnd = cmSystemTools::GetTime() + timeout;
  std::string line;
  while ((timeout = timeEnd - cmSystemTools::GetTime(), timeout > 0)) {
    int p = this->TestProcess->GetNextOutputLine(line, timeout);
    if (p == cmsysProcess_Pipe_None) {
      // Process has terminated and all output read.
      return false;
    }
    if (p == cmsysProcess_Pipe_STDOUT) {
      // Store this line of output.
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->GetIndex()
                   << ": " << line << std::endl);
      this->ProcessOutput += line;
      this->ProcessOutput += "\n";

      // Check for TIMEOUT_AFTER_MATCH property.
      if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
        std::vector<
          std::pair<cmsys::RegularExpression, std::string> >::iterator regIt;
        for (regIt = this->TestProperties->TimeoutRegularExpressions.begin();
             regIt != this->TestProperties->TimeoutRegularExpressions.end();
             ++regIt) {
          if (regIt->first.find(this->ProcessOutput.c_str())) {
            cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->GetIndex()
                         << ": "
                         << "Test timeout changed to "
                         << this->TestProperties->AlternateTimeout
                         << std::endl);
            this->TestProcess->ResetStartTime();
            this->TestProcess->ChangeTimeout(
              this->TestProperties->AlternateTimeout);
            this->TestProperties->TimeoutRegularExpressions.clear();
            break;
          }
        }
      }
    } else { // if(p == cmsysProcess_Pipe_Timeout)
      break;
    }
  }
  return true;
}